

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_Lower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  BYTE BVar2;
  DObject *this;
  player_t *this_00;
  bool bVar3;
  DPSprite *this_01;
  FState *newstate;
  char *__assertion;
  DObject *this_02;
  double dVar4;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c7a1c;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_004c7a0c;
  this_02 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_02 == (DObject *)0x0) goto LAB_004c78cb;
    bVar3 = DObject::IsKindOf(this_02,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004c7a1c;
    }
  }
  else {
    if (this_02 != (DObject *)0x0) goto LAB_004c7a0c;
LAB_004c78cb:
    this_02 = (DObject *)0x0;
  }
  if (numparam == 1) goto LAB_004c7948;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_004c7a0c:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_004c7a1c;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004c7a1c;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_004c7a0c;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_004c7948:
    this_00 = *(player_t **)&this_02[0xc].ObjectFlags;
    if (this_00 != (player_t *)0x0) {
      if (this_00->ReadyWeapon != (AWeapon *)0x0) {
        this_01 = player_t::GetPSprite(this_00,PSP_WEAPON);
        if ((this_00->morphTics == 0) && ((this_00->cheats & 0x800) == 0)) {
          dVar4 = this_01->y + 6.0;
          this_01->y = dVar4;
          if (dVar4 < 128.0) {
            return 0;
          }
        }
        else {
          this_01->y = 128.0;
        }
        BVar2 = this_00->playerstate;
        P_SetPsprite(this_00,PSP_FLASH,(FState *)0x0,false);
        if (BVar2 == '\x01') {
          local_1c.Index = 0x9d;
          newstate = AActor::FindState((AActor *)this_00->ReadyWeapon,&local_1c);
          DPSprite::SetState(this_01,newstate,false);
          return 0;
        }
      }
      P_BringUpWeapon(this_00);
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_004c7a1c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x422,"int AF_A_Lower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Lower)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (nullptr == player->ReadyWeapon)
	{
		P_BringUpWeapon(player);
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	if (player->morphTics || player->cheats & CF_INSTANTWEAPSWITCH)
	{
		psp->y = WEAPONBOTTOM;
	}
	else
	{
		psp->y += LOWERSPEED;
	}
	if (psp->y < WEAPONBOTTOM)
	{ // Not lowered all the way yet
		return 0;
	}
	if (player->playerstate == PST_DEAD)
	{ // Player is dead, so don't bring up a pending weapon
		// Player is dead, so keep the weapon off screen
		P_SetPsprite(player, PSP_FLASH, nullptr);
		psp->SetState(player->ReadyWeapon->FindState(NAME_DeadLowered));
		return 0;
	}
	// [RH] Clear the flash state. Only needed for Strife.
	P_SetPsprite(player, PSP_FLASH, nullptr);
	P_BringUpWeapon (player);
	return 0;
}